

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_cross_product.cpp
# Opt level: O2

SinkResultType __thiscall
duckdb::PhysicalCrossProduct::Sink
          (PhysicalCrossProduct *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSinkInput *input)

{
  pthread_mutex_t *__mutex;
  GlobalSinkState *pGVar1;
  
  pGVar1 = input->global_state;
  __mutex = (pthread_mutex_t *)
            ((long)&pGVar1[3].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex + 8);
  ::std::mutex::lock((mutex *)&__mutex->__data);
  ColumnDataCollection::Append
            ((ColumnDataCollection *)(pGVar1 + 1),
             (ColumnDataAppendState *)
             ((long)&pGVar1[2].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex + 8),
             chunk);
  pthread_mutex_unlock(__mutex);
  return NEED_MORE_INPUT;
}

Assistant:

SinkResultType PhysicalCrossProduct::Sink(ExecutionContext &context, DataChunk &chunk, OperatorSinkInput &input) const {
	auto &sink = input.global_state.Cast<CrossProductGlobalState>();
	lock_guard<mutex> client_guard(sink.rhs_lock);
	sink.rhs_materialized.Append(sink.append_state, chunk);
	return SinkResultType::NEED_MORE_INPUT;
}